

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::AllocateArray<google::protobuf::FieldDescriptor>
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,int array_size)

{
  int iVar1;
  PointerT<char> pcVar2;
  int iVar3;
  int extraout_EAX;
  Nonnull<const_char_*> pcVar4;
  undefined4 in_register_00000034;
  long v2;
  long unaff_R14;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  local_20 [16];
  
  v2 = CONCAT44(in_register_00000034,array_size);
  pcVar2 = (this->pointers_).payload_.super_Base<char>.value;
  if (pcVar2 == (PointerT<char>)0x0) {
    protobuf::(anonymous_namespace)::
    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
    ::AllocateArray<google::protobuf::FieldDescriptor>(local_20);
    iVar3 = extraout_EAX;
  }
  else {
    iVar3 = (this->used_).payload_.super_Base<char>.value;
    unaff_R14 = (long)iVar3;
    iVar3 = array_size * 0x58 + iVar3;
    (this->used_).payload_.super_Base<char>.value = iVar3;
    iVar1 = (this->total_).payload_.super_Base<char>.value;
    v2 = (long)iVar1;
    if (iVar3 <= iVar1) {
      pcVar4 = (Nonnull<const_char_*>)0x0;
      goto LAB_00f209ca;
    }
  }
  pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                     ((long)iVar3,v2,"used <= total_.template Get<TypeToUse>()");
LAB_00f209ca:
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    return (FieldDescriptor *)(pcVar2 + unaff_R14);
  }
  protobuf::(anonymous_namespace)::
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  ::AllocateArray<google::protobuf::FieldDescriptor>();
}

Assistant:

bool has_allocated() const {
    return pointers_.template Get<char>() != nullptr;
  }